

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

int ZSTD_literalsContribution(BYTE *literals,U32 litLength,optState_t *optPtr,int optLevel)

{
  uint *puVar1;
  U32 UVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  UVar2 = ZSTD_rawLiteralsCost(literals,litLength,optPtr,optLevel);
  if (optPtr->priceType == zop_dynamic) {
    if (litLength < 0x40) {
      uVar3 = (uint)(byte)ZSTD_LLcode_LL_Code[litLength];
    }
    else {
      uVar3 = 0x1f;
      if (litLength != 0) {
        for (; litLength >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = (uVar3 ^ 0xffffffe0) + 0x33;
    }
    puVar1 = optPtr->litLengthFreq;
    uVar5 = *puVar1 + 1;
    iVar6 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    if (optLevel == 0) {
      iVar6 = iVar6 << 8;
      uVar5 = 0x1f;
      if (puVar1[uVar3] + 1 != 0) {
        for (; puVar1[uVar3] + 1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      iVar4 = (uVar5 ^ 0x1f) * 0x100 + -0x1f00;
    }
    else {
      iVar6 = (uVar5 * 0x100 >> ((byte)iVar6 & 0x1f)) + iVar6 * 0x100;
      uVar5 = puVar1[uVar3] + 1;
      iVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      iVar4 = -((uVar5 * 0x100 >> ((byte)iVar4 & 0x1f)) + iVar4 * 0x100);
    }
    iVar4 = iVar6 + LL_bits[uVar3] * 0x100 + iVar4;
  }
  else {
    uVar3 = litLength + 1;
    iVar4 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    if (optLevel == 0) {
      iVar4 = iVar4 << 8;
    }
    else {
      iVar4 = (uVar3 * 0x100 >> ((byte)iVar4 & 0x1f)) + iVar4 * 0x100;
    }
  }
  return iVar4 + UVar2;
}

Assistant:

static int ZSTD_literalsContribution(const BYTE* const literals, U32 const litLength,
                                     const optState_t* const optPtr,
                                     int optLevel)
{
    int const contribution = ZSTD_rawLiteralsCost(literals, litLength, optPtr, optLevel)
                           + ZSTD_litLengthContribution(litLength, optPtr, optLevel);
    return contribution;
}